

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O1

void anon_unknown.dwarf_271c4::print_filter_info(item *item,bool temp)

{
  bool bVar1;
  undefined *puVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  
  if ((item->languages)._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
    puVar2 = color::green;
    color::current = color::green;
    if (color::green == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x178640);
    }
    else {
      sVar3 = strlen(color::green);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar3);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(item->languages)._M_dataplus._M_p,
                        (item->languages)._M_string_length);
    puVar2 = color::reset;
    color::current = color::reset;
    if (color::reset == (undefined *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(color::reset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,puVar2,sVar3);
    }
    bVar1 = false;
  }
  if (temp) {
    pcVar5 = ", ";
    if (bVar1) {
      pcVar5 = " [";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,2);
    puVar2 = color::cyan;
    color::current = color::cyan;
    if (color::cyan == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x178640);
    }
    else {
      sVar3 = strlen(color::cyan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"temp",4);
    puVar2 = color::reset;
    color::current = color::reset;
    if (color::reset == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x178640);
    }
    else {
      sVar3 = strlen(color::reset);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar2,sVar3);
    }
    bVar1 = false;
  }
  if (bVar1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  return;
}

Assistant:

void print_filter_info(const setup::item & item, bool temp) {
	
	bool first = true;
	
	if(!item.languages.empty()) {
		std::cout << " [";
		first = false;
		std::cout << color::green << item.languages << color::reset;
	}
	
	if(temp) {
		std::cout << (first ? " [" : ", ");
		first = false;
		std::cout << color::cyan << "temp" << color::reset;
		
	}
	
	if(!first) {
		std::cout << "]";
	}
	
}